

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O0

ZyanStatus
ZydisStringAppendHexU
          (ZyanString *string,ZyanU64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZyanStringView *prefix_local;
  ZyanBool uppercase_local;
  ZyanBool force_leading_number_local;
  ZyanU8 padding_length_local;
  ZyanU64 value_local;
  ZyanString *string_local;
  
  if (((prefix == (ZyanStringView *)0x0) ||
      (string_local._4_4_ = ZydisStringAppend(string,prefix), (string_local._4_4_ & 0x80000000) == 0
      )) && (string_local._4_4_ =
                  ZydisStringAppendHexU64
                            (string,value,padding_length,force_leading_number,uppercase),
            (string_local._4_4_ & 0x80000000) == 0)) {
    if (suffix == (ZyanStringView *)0x0) {
      string_local._4_4_ = 0x100000;
    }
    else {
      string_local._4_4_ = ZydisStringAppend(string,suffix);
    }
  }
  return string_local._4_4_;
}

Assistant:

ZyanStatus ZydisStringAppendHexU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length,
    ZyanBool force_leading_number, ZyanBool uppercase, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    if (prefix)
    {
        ZYAN_CHECK(ZydisStringAppend(string, prefix));
    }

#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
        uppercase));
#else
    if (value & 0xFFFFFFFF00000000)
    {
        ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
            uppercase));
    }
    else
    {
        ZYAN_CHECK(ZydisStringAppendHexU32(string, (ZyanU32)value, padding_length,
            force_leading_number, uppercase));
    }
#endif

    if (suffix)
    {
        return ZydisStringAppend(string, suffix);
    }
    return ZYAN_STATUS_SUCCESS;
}